

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

AspifOutput * __thiscall Potassco::AspifOutput::add(AspifOutput *this,AtomSpan *atoms)

{
  ostream *poVar1;
  size_t sVar2;
  uint *puVar3;
  Span<unsigned_int> *in_RSI;
  AspifOutput *in_RDI;
  Atom_t *x;
  uint *local_18;
  
  poVar1 = std::operator<<(in_RDI->os_," ");
  sVar2 = size<unsigned_int>(in_RSI);
  std::ostream::operator<<(poVar1,sVar2);
  local_18 = begin<unsigned_int>(in_RSI);
  while( true ) {
    puVar3 = end<unsigned_int>((Span<unsigned_int> *)0x2515b7);
    if (local_18 == puVar3) break;
    poVar1 = std::operator<<(in_RDI->os_," ");
    std::ostream::operator<<(poVar1,*local_18);
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

AspifOutput& AspifOutput::add(const AtomSpan& atoms) {
	os_ << " " << size(atoms);
	for (const Atom_t* x = begin(atoms); x != end(atoms); ++x) { os_ << " " << *x; }
	return *this;
}